

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void * nk_memcopy(void *dst0,void *src0,nk_size length)

{
  void *pvVar1;
  nk_size nVar2;
  uint uVar3;
  char *src;
  char *dst;
  long lVar4;
  nk_size nVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  pvVar1 = dst0;
  if (dst0 != src0 && length != 0) {
    if (dst0 < src0) {
      uVar3 = (uint)src0;
      if (((uVar3 | (uint)dst0) & 3) != 0) {
        nVar2 = 4 - (ulong)(uVar3 & 3);
        if (((uVar3 ^ (uint)dst0) & 3) != 0) {
          nVar2 = length;
        }
        if (length < 4) {
          nVar2 = length;
        }
        lVar6 = 0;
        lVar4 = 0;
        do {
          *(undefined1 *)((long)dst0 + lVar6) = *(undefined1 *)((long)src0 + lVar6);
          lVar4 = lVar4 + -1;
          lVar6 = lVar6 + 1;
        } while (-lVar4 != nVar2);
        length = length - nVar2;
        dst0 = (void *)((long)dst0 - lVar4);
        src0 = (void *)((long)src0 - lVar4);
      }
      if (3 < length) {
        lVar4 = 0;
        uVar9 = 0;
        do {
          *(undefined4 *)((long)dst0 + uVar9 * 4) = *(undefined4 *)((long)src0 + uVar9 * 4);
          uVar9 = uVar9 + 1;
          lVar4 = lVar4 + -4;
        } while (length >> 2 != uVar9);
        dst0 = (void *)((long)dst0 - lVar4);
        src0 = (void *)((long)src0 - lVar4);
      }
      if ((length & 3) != 0) {
        uVar9 = 0;
        do {
          *(undefined1 *)((long)dst0 + uVar9) = *(undefined1 *)((long)src0 + uVar9);
          uVar9 = uVar9 + 1;
        } while ((length & 3) != uVar9);
      }
    }
    else {
      lVar6 = (long)src0 + length;
      lVar4 = (long)dst0 + length;
      uVar3 = (uint)lVar6;
      if (((uVar3 | (uint)lVar4) & 3) != 0) {
        nVar2 = (ulong)(uVar3 & 3);
        if (((uVar3 ^ (uint)lVar4) & 3) != 0) {
          nVar2 = length;
        }
        if (length < 5) {
          nVar2 = length;
        }
        lVar7 = -1;
        nVar5 = 0;
        do {
          *(undefined1 *)(lVar4 + lVar7) = *(undefined1 *)(lVar6 + lVar7);
          nVar5 = nVar5 + 1;
          lVar7 = lVar7 + -1;
        } while (nVar2 != nVar5);
        length = length - nVar2;
        lVar4 = lVar4 - nVar5;
        lVar6 = lVar6 - nVar5;
      }
      if (3 < length) {
        lVar7 = 0;
        lVar8 = 0;
        do {
          *(undefined4 *)(lVar4 + -4 + lVar8 * 4) = *(undefined4 *)(lVar6 + -4 + lVar8 * 4);
          lVar8 = lVar8 + -1;
          lVar7 = lVar7 + 4;
        } while (-lVar8 != length >> 2);
        lVar4 = lVar4 - lVar7;
        lVar6 = lVar6 - lVar7;
      }
      if ((length & 3) != 0) {
        lVar7 = 0;
        do {
          *(undefined1 *)(lVar4 + -1 + lVar7) = *(undefined1 *)(lVar6 + -1 + lVar7);
          lVar7 = lVar7 + -1;
        } while (-lVar7 != (length & 3));
      }
    }
  }
  return pvVar1;
}

Assistant:

NK_LIB void*
nk_memcopy(void *dst0, const void *src0, nk_size length)
{
    nk_ptr t;
    char *dst = (char*)dst0;
    const char *src = (const char*)src0;
    if (length == 0 || dst == src)
        goto done;

    #define nk_word int
    #define nk_wsize sizeof(nk_word)
    #define nk_wmask (nk_wsize-1)
    #define NK_TLOOP(s) if (t) NK_TLOOP1(s)
    #define NK_TLOOP1(s) do { s; } while (--t)

    if (dst < src) {
        t = (nk_ptr)src; /* only need low bits */
        if ((t | (nk_ptr)dst) & nk_wmask) {
            if ((t ^ (nk_ptr)dst) & nk_wmask || length < nk_wsize)
                t = length;
            else
                t = nk_wsize - (t & nk_wmask);
            length -= t;
            NK_TLOOP1(*dst++ = *src++);
        }
        t = length / nk_wsize;
        NK_TLOOP(*(nk_word*)(void*)dst = *(const nk_word*)(const void*)src;
            src += nk_wsize; dst += nk_wsize);
        t = length & nk_wmask;
        NK_TLOOP(*dst++ = *src++);
    } else {
        src += length;
        dst += length;
        t = (nk_ptr)src;
        if ((t | (nk_ptr)dst) & nk_wmask) {
            if ((t ^ (nk_ptr)dst) & nk_wmask || length <= nk_wsize)
                t = length;
            else
                t &= nk_wmask;
            length -= t;
            NK_TLOOP1(*--dst = *--src);
        }
        t = length / nk_wsize;
        NK_TLOOP(src -= nk_wsize; dst -= nk_wsize;
            *(nk_word*)(void*)dst = *(const nk_word*)(const void*)src);
        t = length & nk_wmask;
        NK_TLOOP(*--dst = *--src);
    }
    #undef nk_word
    #undef nk_wsize
    #undef nk_wmask
    #undef NK_TLOOP
    #undef NK_TLOOP1
done:
    return (dst0);
}